

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int get_closure_var2(JSContext *ctx,JSFunctionDef *s,JSFunctionDef *fd,BOOL is_local,BOOL is_arg,
                    int var_idx,JSAtom var_name,BOOL is_const,BOOL is_lexical,JSVarKindEnum var_kind
                    )

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = (ulong)(uint)is_const;
  if (s->parent != fd) {
    var_idx = get_closure_var2(ctx,s->parent,fd,is_local,is_arg,var_idx,var_name,is_const,is_lexical
                               ,var_kind);
    uVar4 = (ulong)(uint)var_idx;
    if (var_idx < 0) {
      return -1;
    }
    is_local = 0;
  }
  if (0 < (long)s->closure_var_count) {
    uVar5 = 0;
    do {
      bVar2 = true;
      if (((var_idx == (uint)s->closure_var[uVar5].var_idx) &&
          (bVar1 = *(byte *)(s->closure_var + uVar5), (bVar1 >> 1 & 1) == is_arg)) &&
         (is_local == (bVar1 & 1))) {
        bVar2 = false;
        uVar4 = uVar5 & 0xffffffff;
      }
      if (!bVar2) {
        return (int)uVar4;
      }
      uVar5 = uVar5 + 1;
    } while ((long)s->closure_var_count != uVar5);
  }
  iVar3 = add_closure_var(ctx,s,is_local,is_arg,var_idx,var_name,is_const,is_lexical,var_kind);
  return iVar3;
}

Assistant:

static int get_closure_var2(JSContext *ctx, JSFunctionDef *s,
                            JSFunctionDef *fd, BOOL is_local,
                            BOOL is_arg, int var_idx, JSAtom var_name,
                            BOOL is_const, BOOL is_lexical,
                            JSVarKindEnum var_kind)
{
    int i;

    if (fd != s->parent) {
        var_idx = get_closure_var2(ctx, s->parent, fd, is_local,
                                   is_arg, var_idx, var_name,
                                   is_const, is_lexical, var_kind);
        if (var_idx < 0)
            return -1;
        is_local = FALSE;
    }
    for(i = 0; i < s->closure_var_count; i++) {
        JSClosureVar *cv = &s->closure_var[i];
        if (cv->var_idx == var_idx && cv->is_arg == is_arg &&
            cv->is_local == is_local)
            return i;
    }
    return add_closure_var(ctx, s, is_local, is_arg, var_idx, var_name,
                           is_const, is_lexical, var_kind);
}